

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O3

int PEM_write_bio(BIO *bp,char *name,char *hdr,uchar *data,long len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uchar *out;
  ulong uVar6;
  ulong uVar7;
  int len_00;
  ulong uVar8;
  int outl;
  EVP_ENCODE_CTX ctx;
  int local_84;
  size_t local_80;
  char *local_78;
  uchar *local_70;
  
  local_70 = data;
  EVP_EncodeInit((EVP_ENCODE_CTX *)&stack0xffffffffffffff98);
  sVar4 = strlen(name);
  iVar2 = BIO_write(bp,"-----BEGIN ",0xb);
  out = (uchar *)0x0;
  if (iVar2 == 0xb) {
    iVar2 = BIO_write(bp,name,(int)sVar4);
    if ((iVar2 == (int)sVar4) && (iVar2 = BIO_write(bp,"-----\n",6), iVar2 == 6)) {
      sVar5 = strlen(hdr);
      iVar2 = (int)sVar5;
      if ((iVar2 < 1) ||
         ((iVar3 = BIO_write(bp,hdr,iVar2), iVar3 == iVar2 &&
          (iVar2 = BIO_write(bp,"\n",1), iVar2 == 1)))) {
        out = (uchar *)OPENSSL_malloc(0x2000);
        iVar2 = 0;
        if (out != (uchar *)0x0) {
          local_80 = sVar4;
          local_78 = name;
          if (0 < len) {
            uVar8 = 0;
            iVar2 = 0;
            do {
              uVar6 = 0x1400;
              if ((ulong)len < 0x1400) {
                uVar6 = len;
              }
              EVP_EncodeUpdate((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,out,&local_84,
                               local_70 + uVar8,(int)uVar6);
              iVar3 = 0;
              if ((local_84 != 0) && (iVar3 = BIO_write(bp,out,local_84), iVar3 != local_84))
              goto LAB_00477ce8;
              iVar2 = iVar2 + iVar3;
              uVar8 = (ulong)(uint)((int)uVar8 + (int)uVar6);
              uVar7 = len - uVar6;
              bVar1 = (long)uVar6 <= len;
              len = uVar7;
            } while (uVar7 != 0 && bVar1);
          }
          EVP_EncodeFinal((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,out,&local_84);
          if ((((local_84 < 1) || (iVar3 = BIO_write(bp,out,local_84), iVar3 == local_84)) &&
              (iVar3 = BIO_write(bp,"-----END ",9), iVar3 == 9)) &&
             (((len_00 = (int)local_80, iVar3 = BIO_write(bp,local_78,len_00), iVar3 == len_00 &&
               (iVar3 = BIO_write(bp,"-----\n",6), iVar3 == 6)) &&
              (iVar2 = iVar2 + local_84, iVar2 != 0)))) goto LAB_00477d08;
          goto LAB_00477ce8;
        }
      }
    }
    out = (uchar *)0x0;
  }
LAB_00477ce8:
  ERR_put_error(9,0,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                ,0x215);
  iVar2 = 0;
LAB_00477d08:
  OPENSSL_free(out);
  return iVar2;
}

Assistant:

int PEM_write_bio(BIO *bp, const char *name, const char *header,
                  const unsigned char *data, long len) {
  int nlen, n, i, j, outl;
  unsigned char *buf = NULL;
  EVP_ENCODE_CTX ctx;
  int reason = ERR_R_BUF_LIB;
  int retval = 0;

  EVP_EncodeInit(&ctx);
  nlen = strlen(name);

  if ((BIO_write(bp, "-----BEGIN ", 11) != 11) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }

  i = strlen(header);
  if (i > 0) {
    if ((BIO_write(bp, header, i) != i) || (BIO_write(bp, "\n", 1) != 1)) {
      goto err;
    }
  }

  buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(PEM_BUFSIZE * 8));
  if (buf == NULL) {
    goto err;
  }

  i = j = 0;
  while (len > 0) {
    n = (int)((len > (PEM_BUFSIZE * 5)) ? (PEM_BUFSIZE * 5) : len);
    EVP_EncodeUpdate(&ctx, buf, &outl, &(data[j]), n);
    if ((outl) && (BIO_write(bp, (char *)buf, outl) != outl)) {
      goto err;
    }
    i += outl;
    len -= n;
    j += n;
  }
  EVP_EncodeFinal(&ctx, buf, &outl);
  if ((outl > 0) && (BIO_write(bp, (char *)buf, outl) != outl)) {
    goto err;
  }
  if ((BIO_write(bp, "-----END ", 9) != 9) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }
  retval = i + outl;

err:
  if (retval == 0) {
    OPENSSL_PUT_ERROR(PEM, reason);
  }
  OPENSSL_free(buf);
  return retval;
}